

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

UChar * icu_63::TimeZone::dereferOlsonLink(UnicodeString *id)

{
  UBool UVar1;
  int32_t iVar2;
  UResType UVar3;
  UResourceBundle *resB;
  UResourceBundle *array;
  UChar *pUVar4;
  UChar *tmp;
  int32_t deref;
  int32_t idx;
  UResourceBundle *names;
  UResourceBundle *rb;
  UChar *pUStack_18;
  UErrorCode ec;
  UChar *result;
  UnicodeString *id_local;
  
  pUStack_18 = (UChar *)0x0;
  rb._4_4_ = U_ZERO_ERROR;
  result = (UChar *)id;
  resB = ures_openDirect_63((char *)0x0,"zoneinfo64",(UErrorCode *)((long)&rb + 4));
  array = ures_getByKey_63(resB,"Names",(UResourceBundle *)0x0,(UErrorCode *)((long)&rb + 4));
  iVar2 = findInStringArray(array,(UnicodeString *)result,(UErrorCode *)((long)&rb + 4));
  pUStack_18 = ures_getStringByIndex_63(array,iVar2,(int32_t *)0x0,(UErrorCode *)((long)&rb + 4));
  ures_getByKey_63(resB,"Zones",resB,(UErrorCode *)((long)&rb + 4));
  ures_getByIndex_63(resB,iVar2,resB,(UErrorCode *)((long)&rb + 4));
  UVar1 = ::U_SUCCESS(rb._4_4_);
  if ((UVar1 != '\0') && (UVar3 = ures_getType_63(resB), UVar3 == RES_INT)) {
    iVar2 = ures_getInt_63(resB,(UErrorCode *)((long)&rb + 4));
    pUVar4 = ures_getStringByIndex_63(array,iVar2,(int32_t *)0x0,(UErrorCode *)((long)&rb + 4));
    UVar1 = ::U_SUCCESS(rb._4_4_);
    if (UVar1 != '\0') {
      pUStack_18 = pUVar4;
    }
  }
  ures_close_63(array);
  ures_close_63(resB);
  return pUStack_18;
}

Assistant:

const UChar*
TimeZone::dereferOlsonLink(const UnicodeString& id) {
    const UChar *result = NULL;
    UErrorCode ec = U_ZERO_ERROR;
    UResourceBundle *rb = ures_openDirect(NULL, kZONEINFO, &ec);

    // resolve zone index by name
    UResourceBundle *names = ures_getByKey(rb, kNAMES, NULL, &ec);
    int32_t idx = findInStringArray(names, id, ec);
    result = ures_getStringByIndex(names, idx, NULL, &ec);

    // open the zone bundle by index
    ures_getByKey(rb, kZONES, rb, &ec);
    ures_getByIndex(rb, idx, rb, &ec); 

    if (U_SUCCESS(ec)) {
        if (ures_getType(rb) == URES_INT) {
            // this is a link - dereference the link
            int32_t deref = ures_getInt(rb, &ec);
            const UChar* tmp = ures_getStringByIndex(names, deref, NULL, &ec);
            if (U_SUCCESS(ec)) {
                result = tmp;
            }
        }
    }

    ures_close(names);
    ures_close(rb);

    return result;
}